

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.h
# Opt level: O0

void __thiscall
filtered_directed_graph_t::add_filtered_edge
          (filtered_directed_graph_t *this,vertex_index_t v,vertex_index_t w,value_t filtration)

{
  bool bVar1;
  undefined2 in_DX;
  undefined2 in_SI;
  value_type_conflict2 *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  vertex_index_t in_stack_000000e4;
  vertex_index_t in_stack_000000e6;
  directed_graph_t *in_stack_000000e8;
  float fVar3;
  
  bVar1 = directed_graph_t::add_edge(in_stack_000000e8,in_stack_000000e6,in_stack_000000e4);
  if (bVar1) {
    fVar3 = in_XMM0_Da;
    fVar2 = std::numeric_limits<float>::lowest();
    if ((in_XMM0_Da != fVar2) || (NAN(in_XMM0_Da) || NAN(fVar2))) {
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)CONCAT26(in_SI,CONCAT24(in_DX,fVar3)),
                 in_RDI);
    }
  }
  return;
}

Assistant:

void add_filtered_edge(vertex_index_t v, vertex_index_t w, value_t filtration) {
		if (directed_graph_t::add_edge(v, w) && filtration != std::numeric_limits<value_t>::lowest())
			edge_filtration.push_back(filtration);
	}